

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type *type,bool underlying)

{
  char *__s;
  string *psVar1;
  allocator<char> local_8d [13];
  Type local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  _anonymous_namespace_ *p_Stack_18;
  bool underlying_local;
  Type *type_local;
  
  local_19 = (byte)type & 1;
  p_Stack_18 = this;
  type_local = (Type *)__return_storage_ptr__;
  if (*(int *)this == 0xe) {
    psVar1 = __return_storage_ptr__;
    Type::VectorType(&local_80,(Type *)this);
    GenType_abi_cxx11_(&local_60,(_anonymous_namespace_ *)&local_80,(Type *)0x0,SUB81(psVar1,0));
    std::operator+(&local_40,"[",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"]");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else if (*(int *)this == 0xf) {
    Namespace::GetFullyQualifiedName
              (__return_storage_ptr__,*(Namespace **)(*(long *)(this + 8) + 0xa8),
               *(string **)(this + 8),1000);
  }
  else if ((*(long *)(this + 0x10) == 0) || (((ulong)type & 1) != 0)) {
    __s = TypeName(*(BaseType *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_8d);
    std::allocator<char>::~allocator(local_8d);
  }
  else {
    Namespace::GetFullyQualifiedName
              (__return_storage_ptr__,*(Namespace **)(*(long *)(this + 0x10) + 0xa8),
               *(string **)(this + 0x10),1000);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(const Type &type, bool underlying = false) {
  switch (type.base_type) {
    case BASE_TYPE_STRUCT:
      return type.struct_def->defined_namespace->GetFullyQualifiedName(
          type.struct_def->name);
    case BASE_TYPE_VECTOR: return "[" + GenType(type.VectorType()) + "]";
    default:
      if (type.enum_def && !underlying) {
        return type.enum_def->defined_namespace->GetFullyQualifiedName(
            type.enum_def->name);
      } else {
        return TypeName(type.base_type);
      }
  }
}